

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unowned_ptr.cpp
# Opt level: O0

void __thiscall Unowned_Function_Test::Unowned_Function_Test(Unowned_Function_Test *this)

{
  Unowned_Function_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Unowned_Function_Test_00242f78;
  return;
}

Assistant:

TEST(Unowned, Function)
{
    unowned_ptr<decltype(save)> pNull {};
    EXPECT_ANY_THROW(pNull(1));

    unowned_ptr<decltype(save)> pSave {&save};
    saved = 0;
    pSave(1);
    EXPECT_EQ(saved, 1);
    pSave(2);
    EXPECT_EQ(saved, 2);
    pSave = {};
    EXPECT_ANY_THROW(pSave(2));
}